

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

int cvui::internal::inputUpdateCursor
              (int theWidth,String *theContent,double theFontScale,bool theFocused)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int local_bc;
  int local_b8;
  int local_b4;
  int aContentLength;
  int aRemainingContentChars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_3c;
  int local_38;
  int indexChatToBeRemoved;
  int local_30;
  int local_2c;
  int aCharsFitWidth;
  int aScreenCharSize;
  int key;
  bool theFocused_local;
  double theFontScale_local;
  String *theContent_local;
  int theWidth_local;
  
  if ((theFocused) && (gLastInputKeyPressed != -1)) {
    aCharsFitWidth = gLastInputKeyPressed;
    aScreenCharSize._3_1_ = theFocused;
    _key = theFontScale;
    theFontScale_local = (double)theContent;
    theContent_local._0_4_ = theWidth;
    local_2c = render::getScreenCharWidth(theFontScale);
    dVar1 = theFontScale_local;
    local_30 = (int)theContent_local / local_2c;
    gLastInputKeyPressed = -1;
    if ((0x1f < aCharsFitWidth) && (aCharsFitWidth < 0x7f)) {
      indexChatToBeRemoved = gInput._32_4_ + gInput._40_4_;
      local_38 = std::__cxx11::string::length();
      piVar3 = std::min<int>(&indexChatToBeRemoved,&local_38);
      std::__cxx11::string::insert((ulong)dVar1,(long)*piVar3,'\x01');
      if ((int)gInput._40_4_ < local_30) {
        gInput._40_4_ = gInput._40_4_ + 1;
      }
      else {
        gInput._32_4_ = gInput._32_4_ + 1;
      }
    }
    if (((aCharsFitWidth == 8) && (lVar4 = std::__cxx11::string::length(), lVar4 != 0)) &&
       (0 < (int)gInput._40_4_)) {
      local_3c = gInput._40_4_ + -1;
      std::__cxx11::string::substr((ulong)&local_80,(ulong)theFontScale_local);
      dVar1 = theFontScale_local;
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)dVar1);
      std::operator+(&local_60,&local_80,&local_a0);
      std::__cxx11::string::operator=((string *)theFontScale_local,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      gInput._40_4_ = gInput._40_4_ + -1;
      if ((int)gInput._40_4_ < 0) {
        gInput._40_4_ = 0;
      }
    }
    else if (aCharsFitWidth == 0x270000) {
      uVar5 = (ulong)(int)gInput._40_4_;
      uVar6 = std::__cxx11::string::length();
      if (uVar5 < uVar6) {
        gInput._40_4_ = gInput._40_4_ + 1;
      }
      iVar2 = std::__cxx11::string::length();
      if (local_30 < (int)gInput._40_4_) {
        gInput._40_4_ = local_30;
      }
      if ((gInput._40_4_ == local_30) && (local_30 <= (iVar2 - gInput._32_4_) + -1)) {
        gInput._32_4_ = gInput._32_4_ + 1;
        gInput._40_4_ = gInput._40_4_ + -1;
      }
    }
    else if (aCharsFitWidth == 0x250000) {
      gInput._40_4_ = gInput._40_4_ + -1;
      if ((int)gInput._40_4_ < 0) {
        gInput._40_4_ = 0;
        gInput._32_4_ = gInput._32_4_ + -1;
        local_b4 = 0;
        piVar3 = std::max<int>((int *)(gInput + 0x20),&local_b4);
        gInput._32_4_ = *piVar3;
      }
    }
    else if (((aCharsFitWidth == 0x2e0000) && (-1 < (int)gInput._40_4_)) &&
            (uVar5 = (ulong)(int)gInput._40_4_, uVar6 = std::__cxx11::string::length(),
            uVar5 < uVar6)) {
      std::__cxx11::string::erase((ulong)theFontScale_local,(long)(int)gInput._40_4_);
    }
    else if (aCharsFitWidth == 0x240000) {
      gInput._40_4_ = 0;
      gInput._32_4_ = 0;
    }
    else if (aCharsFitWidth == 0x230000) {
      local_b8 = std::__cxx11::string::length();
      gInput._32_4_ = local_b8 - local_30;
      local_bc = 0;
      piVar3 = std::max<int>((int *)(gInput + 0x20),&local_bc);
      gInput._32_4_ = *piVar3;
      gInput._40_4_ = local_b8 - gInput._32_4_;
    }
    theContent_local._4_4_ = aCharsFitWidth;
  }
  else {
    theContent_local._4_4_ = -1;
  }
  return theContent_local._4_4_;
}

Assistant:

int inputUpdateCursor(int theWidth, cv::String& theContent, double theFontScale, bool theFocused) {
		if (!theFocused || internal::gLastInputKeyPressed == -1) {
            return -1;
        }

		int key = internal::gLastInputKeyPressed;
        int aScreenCharSize = render::getScreenCharWidth(theFontScale);
        int aCharsFitWidth = (int)(theWidth / aScreenCharSize);

        internal::gLastInputKeyPressed = -1;

		if (key >= 32 && key <= 126) {
            theContent.insert(std::min(gInput.contentStartIndex + gInput.cursorIndex, (int)theContent.length()), 1, (char)key);

            if (gInput.cursorIndex < aCharsFitWidth) {
                gInput.cursorIndex++;
            } else {
                gInput.contentStartIndex++;
            }
        }

		if (key == KEY_BACKSPACE && theContent.length() && gInput.cursorIndex > 0) {
			int indexChatToBeRemoved = gInput.cursorIndex - 1;
			theContent = theContent.substr(0, indexChatToBeRemoved) + theContent.substr(indexChatToBeRemoved + 1, theContent.length());
			
            gInput.cursorIndex--;

            if (gInput.cursorIndex < 0) {
                gInput.cursorIndex = 0;
            }
		} else if (key == KEY_ARROW_RIGHT) {
            if (gInput.cursorIndex < theContent.length()) {
                gInput.cursorIndex++;
            }

            int aRemainingContentChars = (int)theContent.length() - gInput.contentStartIndex - 1;

            if (gInput.cursorIndex > aCharsFitWidth) {
                gInput.cursorIndex = aCharsFitWidth;
            }

            if (gInput.cursorIndex == aCharsFitWidth && aRemainingContentChars >= aCharsFitWidth) {
                gInput.contentStartIndex++;
                gInput.cursorIndex--;
            }
        } else if (key == KEY_ARROW_LEFT) {
            gInput.cursorIndex--;

            if (gInput.cursorIndex < 0) {
                gInput.cursorIndex = 0;
                gInput.contentStartIndex--;
                gInput.contentStartIndex = std::max(gInput.contentStartIndex, 0);
            }
        } else if (key == KEY_DELETE && gInput.cursorIndex >= 0 && gInput.cursorIndex < theContent.length()) {
			theContent.erase(gInput.cursorIndex, 1);

        } else if (key == KEY_HOME) {
            gInput.cursorIndex = 0;
            gInput.contentStartIndex = 0;

        } else if (key == KEY_END) {
            int aContentLength = (int)theContent.length();
            gInput.contentStartIndex = aContentLength - aCharsFitWidth;
            gInput.contentStartIndex = std::max(gInput.contentStartIndex, 0);

            gInput.cursorIndex = aContentLength - gInput.contentStartIndex;
        }

        return key;
    }